

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_ryg_dxt.cpp
# Opt level: O0

void ryg_dxt::sInitDXT(void)

{
  int a;
  sInt sVar1;
  int local_14;
  sInt v;
  sInt i_2;
  sInt i_1;
  sInt i;
  
  for (i_2 = 0; i_2 < 0x20; i_2 = i_2 + 1) {
    Expand5[i_2] = (byte)(i_2 << 3) | (byte)(i_2 >> 2);
  }
  for (v = 0; v < 0x40; v = v + 1) {
    Expand6[v] = (byte)(v << 2) | (byte)(v >> 4);
  }
  for (local_14 = 0; local_14 < 0x110; local_14 = local_14 + 1) {
    a = sClamp<int>(local_14 + -8,0,0xff);
    sVar1 = Mul8Bit(a,0x1f);
    QuantRBTab[local_14] = Expand5[sVar1];
    sVar1 = Mul8Bit(a,0x3f);
    QuantGTab[local_14] = Expand6[sVar1];
  }
  PrepareOptTable4(OMatch5,Expand5,0x20);
  PrepareOptTable4(OMatch6,Expand6,0x40);
  PrepareOptTable3(OMatch5_3,Expand5,0x20);
  PrepareOptTable3(OMatch6_3,Expand6,0x40);
  return;
}

Assistant:

void sInitDXT() {
  for (sInt i = 0; i < 32; i++)
    Expand5[i] = (i << 3) | (i >> 2);

  for (sInt i = 0; i < 64; i++)
    Expand6[i] = (i << 2) | (i >> 4);

  for (sInt i = 0; i < 256 + 16; i++) {
    sInt v = sClamp(i - 8, 0, 255);
    QuantRBTab[i] = Expand5[Mul8Bit(v, 31)];
    QuantGTab[i] = Expand6[Mul8Bit(v, 63)];
  }

  PrepareOptTable4(&OMatch5[0][0], Expand5, 32);
  PrepareOptTable4(&OMatch6[0][0], Expand6, 64);

  PrepareOptTable3(&OMatch5_3[0][0], Expand5, 32);
  PrepareOptTable3(&OMatch6_3[0][0], Expand6, 64);
}